

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O0

bool cmBuildCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  size_type sVar1;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar1 == 2) {
    args_local._7_1_ = anon_unknown.dwarf_1c191a::TwoArgsSignature(args,status);
  }
  else {
    args_local._7_1_ = anon_unknown.dwarf_1c191a::MainSignature(args,status);
  }
  return args_local._7_1_;
}

Assistant:

bool cmBuildCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  // Support the legacy signature of the command:
  if (args.size() == 2) {
    return TwoArgsSignature(args, status);
  }

  return MainSignature(args, status);
}